

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# math_utils.hpp
# Opt level: O0

Point center_of_mass<std::vector<cv::Point_<float>,std::allocator<cv::Point_<float>>>>
                (vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_> *list)

{
  float fVar1;
  bool bVar2;
  reference pPVar3;
  size_type sVar4;
  vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_> *in_RSI;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  Point_<float> *p;
  const_iterator __end0;
  const_iterator __begin0;
  vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_> *__range1;
  double mean_y;
  double mean_x;
  vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_> *list_local;
  
  mean_y = 0.0;
  __range1 = (vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_> *)0x0;
  __end0 = std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>::begin(in_RSI);
  p = (Point_<float> *)
      std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>::end(in_RSI);
  while( true ) {
    bVar2 = __gnu_cxx::operator!=
                      (&__end0,(__normal_iterator<const_cv::Point_<float>_*,_std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>_>
                                *)&p);
    if (!bVar2) break;
    pPVar3 = __gnu_cxx::
             __normal_iterator<const_cv::Point_<float>_*,_std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>_>
             ::operator*(&__end0);
    fVar1 = pPVar3->x;
    sVar4 = std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>::size(in_RSI);
    auVar5._8_4_ = (int)(sVar4 >> 0x20);
    auVar5._0_8_ = sVar4;
    auVar5._12_4_ = 0x45300000;
    mean_y = mean_y + (double)fVar1 /
                      ((auVar5._8_8_ - 1.9342813113834067e+25) +
                      ((double)CONCAT44(0x43300000,(int)sVar4) - 4503599627370496.0));
    fVar1 = pPVar3->y;
    sVar4 = std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>::size(in_RSI);
    auVar6._8_4_ = (int)(sVar4 >> 0x20);
    auVar6._0_8_ = sVar4;
    auVar6._12_4_ = 0x45300000;
    __range1 = (vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_> *)
               ((double)fVar1 /
                ((auVar6._8_8_ - 1.9342813113834067e+25) +
                ((double)CONCAT44(0x43300000,(int)sVar4) - 4503599627370496.0)) + (double)__range1);
    __gnu_cxx::
    __normal_iterator<const_cv::Point_<float>_*,_std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>_>
    ::operator++(&__end0);
  }
  cv::Point_<int>::Point_((Point_<int> *)list,(int)mean_y,(int)(double)__range1);
  return (Point)list;
}

Assistant:

inline cv::Point center_of_mass(const T& list)
{
    double mean_x = 0;
    double mean_y = 0;
    for(const auto& p : list)
    {
        mean_x += double(p.x) / list.size();
        mean_y += double(p.y) / list.size();
    }
    return cv::Point(int(mean_x), int(mean_y));
}